

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMateParallel::Initialize
          (ChLinkMateParallel *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> *mpt1,
          ChVector<double> *mpt2,ChVector<double> mnorm1,ChVector<double> mnorm2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<chrono::ChBodyFrame> local_98;
  shared_ptr<chrono::ChBodyFrame> local_88;
  ChVector<double> local_78;
  ChVector<double> local_58;
  ChVector<double> local_38;
  ChVector<double> local_20;
  
  local_20.m_data[0] = *(double *)mnorm1.m_data[0];
  if (this->flipped == false) {
    local_20.m_data[1]._0_4_ = *(undefined4 *)((long)mnorm1.m_data[0] + 8);
    local_20.m_data[1]._4_4_ = *(uint *)((long)mnorm1.m_data[0] + 0xc);
    local_20.m_data[2]._0_4_ = *(undefined4 *)((long)mnorm1.m_data[0] + 0x10);
    local_20.m_data[2]._4_4_ = *(uint *)((long)mnorm1.m_data[0] + 0x14);
  }
  else {
    local_20.m_data[0] = -local_20.m_data[0];
    local_20.m_data[1]._0_4_ = *(undefined4 *)((long)mnorm1.m_data[0] + 8);
    local_20.m_data[2]._0_4_ = *(undefined4 *)((long)mnorm1.m_data[0] + 0x10);
    local_20.m_data[1]._4_4_ = *(uint *)((long)mnorm1.m_data[0] + 0xc) ^ 0x80000000;
    local_20.m_data[2]._4_4_ = *(uint *)((long)mnorm1.m_data[0] + 0x14) ^ 0x80000000;
  }
  local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var1 = (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_98.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var1 = (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_38.m_data[0] = mpt1->m_data[0];
  local_38.m_data[1] = mpt1->m_data[1];
  local_38.m_data[2] = mpt1->m_data[2];
  local_58.m_data[0] = mpt2->m_data[0];
  local_58.m_data[1] = mpt2->m_data[1];
  local_58.m_data[2] = mpt2->m_data[2];
  local_78.m_data[0] = *(double *)mnorm1.m_data[1];
  local_78.m_data[1] = *(double *)((long)mnorm1.m_data[1] + 8);
  local_78.m_data[2] = *(double *)((long)mnorm1.m_data[1] + 0x10);
  ChLinkMateGeneric::Initialize
            (&this->super_ChLinkMateGeneric,&local_88,&local_98,pos_are_relative,&local_38,&local_58
             ,&local_20,&local_78);
  if (local_98.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChLinkMateParallel::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                    std::shared_ptr<ChBodyFrame> mbody2,
                                    bool pos_are_relative,
                                    ChVector<> mpt1,
                                    ChVector<> mpt2,
                                    ChVector<> mnorm1,
                                    ChVector<> mnorm2) {
    // set the two frames so that they have the X axis aligned when the
    // two axes are aligned (default behavior, otherwise is considered 'flipped')

    ChVector<> mnorm1_reversed;
    if (!flipped)
        mnorm1_reversed = mnorm1;
    else
        mnorm1_reversed = -mnorm1;

    ChLinkMateGeneric::Initialize(mbody1, mbody2, pos_are_relative, mpt1, mpt2, mnorm1_reversed, mnorm2);
}